

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerArrayDetachedCheck(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar4;
  Opnd *this_01;
  LabelInstr *target;
  LabelInstr *insertBeforeInstr;
  
  this_00 = Func::GetJITFunctionBody(this->m_func);
  bVar3 = JITTimeFunctionBody::IsAsmJsMode(this_00);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x26b0,"(m_func->GetJITFunctionBody()->IsAsmJsMode())",
                       "m_func->GetJITFunctionBody()->IsAsmJsMode()");
    if (!bVar3) goto LAB_00553ce5;
    *puVar4 = 0;
  }
  pIVar1 = instr->m_prev;
  this_01 = IR::Instr::UnlinkSrc1(instr);
  bVar3 = IR::Opnd::IsIndirOpnd(this_01);
  if (!bVar3) {
    bVar3 = IR::Opnd::IsMemRefOpnd(this_01);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x26b4,"(isDetachedOpnd->IsIndirOpnd() || isDetachedOpnd->IsMemRefOpnd())"
                         ,"isDetachedOpnd->IsIndirOpnd() || isDetachedOpnd->IsMemRefOpnd()");
      if (!bVar3) {
LAB_00553ce5:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
  }
  target = InsertLabel(false,instr->m_next);
  insertBeforeInstr = InsertLabel(true,instr);
  InsertTestBranch(this_01,this_01,BrNotNeq_A,target,&insertBeforeInstr->super_Instr);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,instr,HelperOp_OutOfMemoryError,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerArrayDetachedCheck(IR::Instr * instr)
{
    // TEST isDetached, isDetached
    // JE Done
    // Helper:
    // CALL Js::Throw::OutOfMemory
    // Done:

    Assert(m_func->GetJITFunctionBody()->IsAsmJsMode());
    IR::Instr * instrPrev = instr->m_prev;

    IR::Opnd * isDetachedOpnd = instr->UnlinkSrc1();
    Assert(isDetachedOpnd->IsIndirOpnd() || isDetachedOpnd->IsMemRefOpnd());

    IR::LabelInstr * doneLabel = InsertLabel(false, instr->m_next);
    IR::LabelInstr * helperLabel = InsertLabel(true, instr);

    InsertTestBranch(isDetachedOpnd, isDetachedOpnd, Js::OpCode::BrNotNeq_A, doneLabel, helperLabel);

    m_lowererMD.ChangeToHelperCall(instr, IR::HelperOp_OutOfMemoryError);

    return instrPrev;
}